

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkAfterTrim(Aig_Man_t *pMan,Abc_Ntk_t *pNtkOld)

{
  Abc_Aig_t *pMan_00;
  int iVar1;
  Abc_Ntk_t *pNtk;
  Abc_Obj_t *pAVar2;
  void *pvVar3;
  Abc_Obj_t *pAVar4;
  char *pcVar5;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t *pAVar7;
  Vec_Ptr_t *p;
  int iVar8;
  Abc_Ntk_t *pAVar9;
  int iVar10;
  
  if (pMan->nAsserts != 0) {
    __assert_fail("pMan->nAsserts == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDar.c"
                  ,0x447,"Abc_Ntk_t *Abc_NtkAfterTrim(Aig_Man_t *, Abc_Ntk_t *)");
  }
  if (pNtkOld->nBarBufs != 0) {
    __assert_fail("pNtkOld->nBarBufs == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDar.c"
                  ,0x448,"Abc_Ntk_t *Abc_NtkAfterTrim(Aig_Man_t *, Abc_Ntk_t *)");
  }
  if (pNtkOld->nObjCounts[8] < pMan->nRegs) {
    __assert_fail("Aig_ManRegNum(pMan) <= Abc_NtkLatchNum(pNtkOld)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDar.c"
                  ,0x449,"Abc_Ntk_t *Abc_NtkAfterTrim(Aig_Man_t *, Abc_Ntk_t *)");
  }
  if (pMan->nTruePis <= pNtkOld->vCis->nSize) {
    if (pMan->nTruePos != pNtkOld->vPos->nSize) {
      __assert_fail("Saig_ManPoNum(pMan) == Abc_NtkPoNum(pNtkOld)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDar.c"
                    ,1099,"Abc_Ntk_t *Abc_NtkAfterTrim(Aig_Man_t *, Abc_Ntk_t *)");
    }
    if (pMan->vCiNumsOrig != (Vec_Int_t *)0x0) {
      pNtk = Abc_NtkAlloc(ABC_NTK_STRASH,ABC_FUNC_AIG,1);
      iVar10 = pMan->nBarBufs;
      pNtk->nConstrs = pMan->nConstrs;
      pNtk->nBarBufs = iVar10;
      pAVar2 = Abc_AigConst1(pNtk);
      (pMan->pConst1->field_5).pData = pAVar2;
      for (iVar10 = 0; iVar1 = pMan->nRegs, iVar10 < pMan->nObjs[2] - iVar1; iVar10 = iVar10 + 1) {
        pvVar3 = Vec_PtrEntry(pMan->vCis,iVar10);
        pAVar2 = Abc_NtkCreatePi(pNtk);
        *(Abc_Obj_t **)((long)pvVar3 + 0x28) = pAVar2;
        iVar1 = Vec_IntEntry(pMan->vCiNumsOrig,iVar10);
        pAVar4 = Abc_NtkCi(pNtkOld,iVar1);
        pcVar5 = Abc_ObjName(pAVar4);
        Abc_ObjAssignName(pAVar2,pcVar5,(char *)0x0);
      }
      for (iVar10 = 0; iVar8 = pMan->nObjs[3] - iVar1, iVar10 < iVar8; iVar10 = iVar10 + 1) {
        pvVar3 = Vec_PtrEntry(pMan->vCos,iVar10);
        pAVar2 = Abc_NtkCreatePo(pNtk);
        *(Abc_Obj_t **)((long)pvVar3 + 0x28) = pAVar2;
        pAVar4 = Abc_NtkCo(pNtkOld,iVar10);
        pcVar5 = Abc_ObjName(pAVar4);
        Abc_ObjAssignName(pAVar2,pcVar5,(char *)0x0);
        iVar1 = pMan->nRegs;
      }
      if (pNtk->vCis->nSize == pMan->nObjs[2] - iVar1) {
        if (pNtk->vCos->nSize == iVar8) {
          for (iVar10 = 0; iVar10 < iVar1; iVar10 = iVar10 + 1) {
            pAVar6 = Aig_ManLi(pMan,iVar10);
            pAVar7 = Aig_ManLo(pMan,iVar10);
            pAVar2 = Abc_NtkCreateLatch(pNtk);
            pAVar4 = Abc_NtkCreateBi(pNtk);
            (pAVar6->field_5).pData = pAVar4;
            pAVar4 = Abc_NtkCreateBo(pNtk);
            (pAVar7->field_5).pData = pAVar4;
            Abc_ObjAddFanin(pAVar2,(Abc_Obj_t *)(pAVar6->field_5).pData);
            Abc_ObjAddFanin((Abc_Obj_t *)(pAVar7->field_5).pData,pAVar2);
            Abc_LatchSetInit0(pAVar2);
            iVar1 = Vec_IntEntry(pMan->vCiNumsOrig,pMan->nTruePis + iVar10);
            pAVar4 = Abc_NtkCi(pNtkOld,iVar1);
            pAVar2 = (Abc_Obj_t *)(pAVar7->field_5).pData;
            pcVar5 = Abc_ObjName(pAVar4);
            Abc_ObjAssignName(pAVar2,pcVar5,(char *)0x0);
            pAVar4 = Abc_NtkCo(pNtkOld,pMan->nTruePos + iVar10);
            pAVar2 = (Abc_Obj_t *)(pAVar6->field_5).pData;
            pcVar5 = Abc_ObjName(pAVar4);
            Abc_ObjAssignName(pAVar2,pcVar5,(char *)0x0);
            iVar1 = pMan->nRegs;
          }
          p = Aig_ManDfs(pMan,1);
          for (iVar10 = 0; iVar10 < p->nSize; iVar10 = iVar10 + 1) {
            pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(p,iVar10);
            if ((*(uint *)&pAVar6->field_0x18 & 7) == 4) {
              pAVar2 = (Abc_Obj_t *)Aig_ObjChild0Copy(pAVar6);
            }
            else {
              pMan_00 = (Abc_Aig_t *)pNtk->pManFunc;
              pAVar2 = (Abc_Obj_t *)Aig_ObjChild0Copy(pAVar6);
              pAVar4 = (Abc_Obj_t *)Aig_ObjChild1Copy(pAVar6);
              pAVar2 = Abc_AigAnd(pMan_00,pAVar2,pAVar4);
            }
            (pAVar6->field_5).pData = pAVar2;
          }
          Vec_PtrFree(p);
          for (iVar10 = 0; iVar10 < pMan->vCos->nSize; iVar10 = iVar10 + 1) {
            pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(pMan->vCos,iVar10);
            pAVar2 = (Abc_Obj_t *)Aig_ObjChild0Copy(pAVar6);
            pAVar4 = Abc_NtkCo(pNtk,iVar10);
            Abc_ObjAddFanin(pAVar4,pAVar2);
          }
          pAVar9 = pNtk;
          iVar10 = Abc_NtkCheck(pNtk);
          if (iVar10 == 0) {
            Abc_Print((int)pAVar9,"Abc_NtkAfterTrim(): Network check has failed.\n");
          }
          return pNtk;
        }
        __assert_fail("Abc_NtkCoNum(pNtkNew) == Aig_ManCoNum(pMan) - Aig_ManRegNum(pMan)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDar.c"
                      ,0x468,"Abc_Ntk_t *Abc_NtkAfterTrim(Aig_Man_t *, Abc_Ntk_t *)");
      }
      __assert_fail("Abc_NtkCiNum(pNtkNew) == Aig_ManCiNum(pMan) - Aig_ManRegNum(pMan)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDar.c"
                    ,0x467,"Abc_Ntk_t *Abc_NtkAfterTrim(Aig_Man_t *, Abc_Ntk_t *)");
    }
    __assert_fail("pMan->vCiNumsOrig != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDar.c"
                  ,0x44c,"Abc_Ntk_t *Abc_NtkAfterTrim(Aig_Man_t *, Abc_Ntk_t *)");
  }
  __assert_fail("Saig_ManPiNum(pMan) <= Abc_NtkCiNum(pNtkOld)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDar.c"
                ,0x44a,"Abc_Ntk_t *Abc_NtkAfterTrim(Aig_Man_t *, Abc_Ntk_t *)");
}

Assistant:

Abc_Ntk_t * Abc_NtkAfterTrim( Aig_Man_t * pMan, Abc_Ntk_t * pNtkOld )
{
    Vec_Ptr_t * vNodes; 
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pObjNew, * pObjOld;
    Aig_Obj_t * pObj, * pObjLo, * pObjLi;
    int i; 
    assert( pMan->nAsserts == 0 );
    assert( pNtkOld->nBarBufs == 0 );
    assert( Aig_ManRegNum(pMan) <= Abc_NtkLatchNum(pNtkOld) );
    assert( Saig_ManPiNum(pMan) <= Abc_NtkCiNum(pNtkOld) );
    assert( Saig_ManPoNum(pMan) == Abc_NtkPoNum(pNtkOld) );
    assert( pMan->vCiNumsOrig != NULL );
    // perform strashing
    pNtkNew = Abc_NtkAlloc( ABC_NTK_STRASH, ABC_FUNC_AIG, 1 );
    pNtkNew->nConstrs = pMan->nConstrs;
    pNtkNew->nBarBufs = pMan->nBarBufs;
    // duplicate the name and the spec
//    pNtkNew->pName = Extra_UtilStrsav(pMan->pName);
//    pNtkNew->pSpec = Extra_UtilStrsav(pMan->pSpec);
    Aig_ManConst1(pMan)->pData = Abc_AigConst1(pNtkNew);
    // create PIs
    Aig_ManForEachPiSeq( pMan, pObj, i )
    {
        pObjNew = Abc_NtkCreatePi( pNtkNew );
        pObj->pData = pObjNew;
        // find the name
        pObjOld = Abc_NtkCi( pNtkOld, Vec_IntEntry(pMan->vCiNumsOrig, i) );
        Abc_ObjAssignName( pObjNew, Abc_ObjName(pObjOld), NULL );
    }
    // create POs
    Aig_ManForEachPoSeq( pMan, pObj, i )
    {
        pObjNew = Abc_NtkCreatePo( pNtkNew );
        pObj->pData = pObjNew;
        // find the name
        pObjOld = Abc_NtkCo( pNtkOld, i );
        Abc_ObjAssignName( pObjNew, Abc_ObjName(pObjOld), NULL );
    }
    assert( Abc_NtkCiNum(pNtkNew) == Aig_ManCiNum(pMan) - Aig_ManRegNum(pMan) );
    assert( Abc_NtkCoNum(pNtkNew) == Aig_ManCoNum(pMan) - Aig_ManRegNum(pMan) );
    // create as many latches as there are registers in the manager
    Aig_ManForEachLiLoSeq( pMan, pObjLi, pObjLo, i )
    {
        pObjNew = Abc_NtkCreateLatch( pNtkNew );
        pObjLi->pData = Abc_NtkCreateBi( pNtkNew );
        pObjLo->pData = Abc_NtkCreateBo( pNtkNew );
        Abc_ObjAddFanin( pObjNew, (Abc_Obj_t *)pObjLi->pData );
        Abc_ObjAddFanin( (Abc_Obj_t *)pObjLo->pData, pObjNew );
        Abc_LatchSetInit0( pObjNew );
        // find the name
        pObjOld = Abc_NtkCi( pNtkOld, Vec_IntEntry(pMan->vCiNumsOrig, Saig_ManPiNum(pMan)+i) );
        Abc_ObjAssignName( (Abc_Obj_t *)pObjLo->pData, Abc_ObjName(pObjOld), NULL );
        // find the name
        pObjOld = Abc_NtkCo( pNtkOld, Saig_ManPoNum(pMan)+i );
        Abc_ObjAssignName( (Abc_Obj_t *)pObjLi->pData, Abc_ObjName(pObjOld), NULL );
    }
    // rebuild the AIG
    vNodes = Aig_ManDfs( pMan, 1 );
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
        if ( Aig_ObjIsBuf(pObj) )
            pObj->pData = (Abc_Obj_t *)Aig_ObjChild0Copy(pObj);
        else
            pObj->pData = Abc_AigAnd( (Abc_Aig_t *)pNtkNew->pManFunc, (Abc_Obj_t *)Aig_ObjChild0Copy(pObj), (Abc_Obj_t *)Aig_ObjChild1Copy(pObj) );
    Vec_PtrFree( vNodes );
    // connect the PO nodes
    Aig_ManForEachCo( pMan, pObj, i )
    {
        pObjNew = (Abc_Obj_t *)Aig_ObjChild0Copy(pObj);
        Abc_ObjAddFanin( Abc_NtkCo(pNtkNew, i), pObjNew );
    }
    // check the resulting AIG
    if ( !Abc_NtkCheck( pNtkNew ) )
        Abc_Print( 1, "Abc_NtkAfterTrim(): Network check has failed.\n" );
    return pNtkNew;
}